

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O3

void incdec_verify::PreDecTestInt32(void)

{
  bool expected;
  int t;
  long lVar1;
  string local_50;
  
  lVar1 = 8;
  do {
    t = *(int *)(&UNK_0014dbf8 + lVar1);
    expected = *(bool *)((long)&dec_int32 + lVar1);
    if ((t + -1 == *(int *)(&UNK_0014dbfc + lVar1)) != expected) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error in case dec_int32 throw (1): ","");
      err_msg<int>(&local_50,t,expected);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x74);
  return;
}

Assistant:

void PreDecTestInt32()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_int32); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int32_t > si(dec_int32[i].x);
			SafeInt< std::int32_t > vv = --si;

			if(vv != dec_int32[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_int32[i].fExpected )
		{
			err_msg( "Error in case dec_int32 throw (1): ", dec_int32[i].x, dec_int32[i].fExpected );
		}
	}
}